

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,for_in_statement *s)

{
  int iVar1;
  undefined4 extraout_var;
  expression *e;
  statement *s_00;
  char *ctx;
  for_in_statement *s_local;
  print_visitor *this_local;
  
  ctx = "for (";
  std::operator<<(this->os_,"for (");
  iVar1 = for_in_statement::init(s,(EVP_PKEY_CTX *)ctx);
  accept<mjs::print_visitor>((statement *)CONCAT44(extraout_var,iVar1),this);
  std::operator<<(this->os_," in ");
  e = for_in_statement::e(s);
  accept<mjs::print_visitor>(e,this);
  std::operator<<(this->os_,") ");
  s_00 = for_in_statement::s(s);
  accept<mjs::print_visitor>(s_00,this);
  return;
}

Assistant:

void operator()(const for_in_statement& s){
        os_ << "for (";
        accept(s.init(), *this);
        os_ << " in ";
        accept(s.e(), *this);
        os_ << ") ";
        accept(s.s(), *this);
    }